

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2117e76::DropoutTest_KeepsLargeCoeffs_Test::TestBody
          (DropoutTest_KeepsLargeCoeffs_Test *this)

{
  int in_ECX;
  long lVar1;
  int *piVar2;
  int *piVar3;
  tran_low_t *in_R8;
  byte bVar4;
  initializer_list<int> __l;
  tran_low_t qcoeff_scan [32];
  allocator_type local_131;
  vector<int,_std::allocator<int>_> local_130;
  tran_low_t local_118 [34];
  int local_90 [32];
  
  bVar4 = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[0x14] = 0;
  local_118[0x15] = 0;
  local_118[0x1c] = 0;
  local_118[0x1d] = 0;
  local_118[0x1e] = 0;
  local_118[0x1f] = 0;
  local_118[0x18] = 0;
  local_118[0x19] = 0;
  local_118[0x1a] = 0;
  local_118[0x1b] = 0;
  local_118[0x10] = 0;
  local_118[0x11] = 0;
  local_118[0x12] = 0;
  local_118[0x13] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[6] = 0x2a;
  local_118[7] = 0;
  local_118[0x16] = 0;
  local_118[0x17] = -0x1e;
  Dropout('\x06','\x06',(int)local_118,in_ECX,in_R8);
  piVar2 = &DAT_00d134e0;
  piVar3 = local_90;
  for (lVar1 = 0x20; lVar1 != 0; lVar1 = lVar1 + -1) {
    *piVar3 = *piVar2;
    piVar2 = piVar2 + (ulong)bVar4 * -2 + 1;
    piVar3 = piVar3 + (ulong)bVar4 * -2 + 1;
  }
  __l._M_len = 0x20;
  __l._M_array = local_90;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l,&local_131);
  ExpectArrayEq(local_118,&local_130);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(DropoutTest, KeepsLargeCoeffs) {
  const TX_SIZE tx_size = TX_8X4;
  const uint32_t dropout_num_before = 4;
  const uint32_t dropout_num_after = 6;
  // Large isolated coeffs should be preserved.
  tran_low_t qcoeff_scan[] = { 0, 0, 0, 0, 0, 0, 42, 0,    // should be kept
                               0, 0, 0, 0, 0, 0, 0,  0,    //
                               0, 0, 0, 0, 0, 0, 0,  -30,  // should be kept
                               0, 0, 0, 0, 0, 0, 0,  0 };
  Dropout(tx_size, kTxType, dropout_num_before, dropout_num_after, qcoeff_scan);
  ExpectArrayEq(qcoeff_scan, { 0, 0, 0, 0, 0, 0, 42, 0,    //
                               0, 0, 0, 0, 0, 0, 0,  0,    //
                               0, 0, 0, 0, 0, 0, 0,  -30,  //
                               0, 0, 0, 0, 0, 0, 0,  0 });
}